

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O1

void __thiscall UiWindow::UiWindow(UiWindow *this,Image *image,string *title)

{
  pointer pcVar1;
  
  this->_vptr_UiWindow = (_func_int **)&PTR__UiWindow_00120c88;
  (this->_image)._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00120b28;
  (this->_image)._data = (uchar *)0x0;
  (this->_image)._type = image->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy
            (&this->_image,(EVP_PKEY_CTX *)image,(EVP_PKEY_CTX *)title);
  (this->_title)._M_dataplus._M_p = (pointer)&(this->_title).field_2;
  pcVar1 = (title->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_title,pcVar1,pcVar1 + title->_M_string_length);
  this->_shown = false;
  return;
}

Assistant:

UiWindow::UiWindow( const PenguinV_Image::Image & image, const std::string & title )
    : _image( image )
    , _title( title )
    , _shown( false )
{
}